

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromGetResult(FpgaIO *this,uint32_t *result,PromType type)

{
  BasePort *pBVar1;
  uint uVar2;
  nodeaddr_t nVar3;
  bool ret;
  nodeaddr_t address;
  quadlet_t read_data;
  PromType type_local;
  uint32_t *result_local;
  FpgaIO *this_local;
  
  address._4_4_ = type;
  _read_data = result;
  result_local = (uint32_t *)this;
  nVar3 = GetPromAddress(this,type,false);
  pBVar1 = (this->super_BoardIO).port;
  uVar2 = (*pBVar1->_vptr_BasePort[0x23])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3,&address);
  if ((uVar2 & 1) != 0) {
    *_read_data = (uint32_t)address;
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool FpgaIO::PromGetResult(uint32_t &result, PromType type)
{
    quadlet_t read_data;
    nodeaddr_t address = GetPromAddress(type, false);

    bool ret = port->ReadQuadlet(BoardId, address, read_data);
    if (ret)
        result = static_cast<uint32_t>(read_data);
    return ret;
}